

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O2

float __thiscall CUI::DoScrollbarH(CUI *this,void *pID,CUIRect *pRect,float Current)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  long in_FS_OFFSET;
  float fVar4;
  float fVar5;
  vec4 local_68;
  CUIRect Handle;
  CUIRect Rail;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  fVar5 = 1.0;
  if (Current <= 1.0) {
    fVar5 = Current;
  }
  fVar5 = (float)(~-(uint)(Current < 0.0) & (uint)fVar5);
  CUIRect::HMargin(pRect,5.0,&Rail);
  fVar4 = Rail.w / 3.0;
  if (33.0 <= Rail.w / 3.0) {
    fVar4 = 33.0;
  }
  CUIRect::VSplitLeft(&Rail,(float)(-(uint)(33.0 < Rail.h) & (uint)Rail.h |
                                   ~-(uint)(33.0 < Rail.h) & (uint)fVar4),&Handle,(CUIRect *)0x0);
  Handle.x = (Rail.w - Handle.w) * fVar5 + Handle.x;
  bVar2 = MouseHovered(this,&Handle);
  bVar3 = MouseHovered(this,&Rail);
  if (this->m_pActiveItem == pID) {
    this->m_ActiveItemValid = true;
    bVar3 = true;
    if ((this->m_MouseButtons & 1) != 0) goto LAB_0017f2c1;
    this->m_pActiveItem = (void *)0x0;
LAB_0017f295:
    bVar3 = false;
  }
  else {
    if (this->m_pHotItem == pID) {
      if ((this->m_MouseButtons & 1) == 0) goto LAB_0017f295;
      DoScrollbarH::s_OffsetX = this->m_MouseX - Handle.x;
    }
    else {
      if ((((~bVar3 | (byte)this->m_LastMouseButtons) & 1) != 0 || bVar2) ||
          (this->m_MouseButtons & 1) == 0) goto LAB_0017f295;
      DoScrollbarH::s_OffsetX = Handle.w * 0.5;
    }
    this->m_ActiveItemValid = true;
    this->m_pActiveItem = pID;
    bVar3 = true;
    if (pID != (void *)0x0) {
      this->m_pLastActiveItem = pID;
    }
  }
LAB_0017f2c1:
  if (bVar2) {
    this->m_pBecommingHotItem = pID;
  }
  if (bVar3) {
    fVar4 = ((this->m_MouseX - DoScrollbarH::s_OffsetX) - Rail.x) / (Rail.w - Handle.w);
    fVar5 = 1.0;
    if (fVar4 <= 1.0) {
      fVar5 = fVar4;
    }
    fVar5 = (float)(~-(uint)(fVar4 < 0.0) & (uint)fVar5);
  }
  local_68.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3f800000;
  local_68.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3f800000;
  local_68.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3f800000;
  local_68.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3e800000;
  CUIRect::Draw(&Rail,&local_68,Rail.h * 0.5,0xf);
  local_68.field_0.x = 1.0;
  local_68.field_1.y = 1.0;
  if (!bVar2) {
    local_68.field_0.x = 0.8;
    local_68.field_1.y = 0.8;
  }
  if (bVar3) {
    local_68.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3f666666;
    local_68.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3f666666;
  }
  local_68.field_3.w = 1.0;
  local_68.field_2.z = local_68.field_0.x;
  CUIRect::Draw(&Handle,&local_68,Handle.h * 0.5,0xf);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return fVar5;
}

Assistant:

float CUI::DoScrollbarH(const void *pID, const CUIRect *pRect, float Current)
{
	Current = clamp(Current, 0.0f, 1.0f);

	// layout
	CUIRect Rail;
	pRect->HMargin(5.0f, &Rail);

	CUIRect Handle;
	Rail.VSplitLeft(clamp(33.0f, Rail.h, Rail.w / 3.0f), &Handle, 0);
	Handle.x += (Rail.w - Handle.w) * Current;

	// logic
	static float s_OffsetX;
	const bool InsideHandle = MouseHovered(&Handle);
	const bool InsideRail = MouseHovered(&Rail);
	bool Grabbed = false; // whether to apply the offset

	if(CheckActiveItem(pID))
	{
		if(MouseButton(0))
			Grabbed = true;
		else
			SetActiveItem(0);
	}
	else if(HotItem() == pID)
	{
		if(MouseButton(0))
		{
			s_OffsetX = MouseX() - Handle.x;
			SetActiveItem(pID);
			Grabbed = true;
		}
	}
	else if(MouseButtonClicked(0) && !InsideHandle && InsideRail)
	{
		s_OffsetX = Handle.w / 2.0f;
		SetActiveItem(pID);
		Grabbed = true;
	}

	if(InsideHandle)
	{
		SetHotItem(pID);
	}

	float ReturnValue = Current;
	if(Grabbed)
	{
		const float Min = Rail.x;
		const float Max = Rail.w - Handle.w;
		const float Cur = MouseX() - s_OffsetX;
		ReturnValue = clamp((Cur - Min) / Max, 0.0f, 1.0f);
	}

	// render
	Rail.Draw(vec4(1.0f, 1.0f, 1.0f, 0.25f), Rail.h / 2.0f);
	Handle.Draw(ScrollBarColorFunction.GetColor(Grabbed, InsideHandle), Handle.h / 2.0f);

	return ReturnValue;
}